

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<char> local_139;
  string local_138;
  undefined1 local_118 [8];
  string temp4;
  string local_f0;
  undefined1 local_d0 [8];
  string temp3;
  string local_a8;
  undefined1 local_88 [8];
  string temp2;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string temp;
  
  temp.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"the-stealth-warrior",&local_51);
  to_camel_case((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"a_pippi_isOmoshiroi",
             (allocator<char> *)(temp3.field_2._M_local_buf + 0xf));
  to_camel_case((string *)local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(temp3.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"theCat_Was_Savage",
             (allocator<char> *)(temp4.field_2._M_local_buf + 0xf));
  to_camel_case((string *)local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)(temp4.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"the_Cat_Is_Omoshiroi",&local_139);
  to_camel_case((string *)local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  temp.field_2._12_4_ = 0;
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_30);
  return temp.field_2._12_4_;
}

Assistant:

int main()
{
	std::string temp = to_camel_case("the-stealth-warrior");
	std::string temp2 = to_camel_case("a_pippi_isOmoshiroi");
	std::string temp3 = to_camel_case("theCat_Was_Savage");
	std::string temp4 = to_camel_case("the_Cat_Is_Omoshiroi");

	return 0;
}